

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genHeader_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  string s;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DATAHANDLER","");
  std::operator+(&local_50,"#ifndef INCLUDE_",&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_c8 = *puVar4;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar4;
    local_d8 = (ulong *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d8);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_88 = *plVar5;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar5;
    local_98 = (long *)*plVar2;
  }
  local_90 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_98,(ulong)local_70._M_dataplus._M_p);
  local_198 = &local_188;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_188 = *plVar5;
    lStack_180 = plVar2[3];
  }
  else {
    local_188 = *plVar5;
    local_198 = (long *)*plVar2;
  }
  local_190 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_198);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_108 = *plVar5;
    lStack_100 = plVar2[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *plVar5;
    local_118 = (long *)*plVar2;
  }
  local_110 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_178 = &local_168;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_168 = *plVar5;
    lStack_160 = plVar2[3];
  }
  else {
    local_168 = *plVar5;
    local_178 = (long *)*plVar2;
  }
  local_170 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_158 = &local_148;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_148 = *plVar5;
    lStack_140 = plVar2[3];
  }
  else {
    local_148 = *plVar5;
    local_158 = (long *)*plVar2;
  }
  local_150 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
  local_1b8 = &local_1a8;
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_1a8 = *puVar4;
    lStack_1a0 = plVar2[3];
  }
  else {
    local_1a8 = *puVar4;
    local_1b8 = (ulong *)*plVar2;
  }
  local_1b0 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_1d8 = &local_1c8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_1c8 = *plVar5;
    lStack_1c0 = plVar2[3];
  }
  else {
    local_1c8 = *plVar5;
    local_1d8 = (long *)*plVar2;
  }
  local_1d0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  local_138 = &local_128;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_128 = *plVar5;
    lStack_120 = plVar2[3];
  }
  else {
    local_128 = *plVar5;
    local_138 = (long *)*plVar2;
  }
  local_130 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_a8 = *plVar5;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar5;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_e8 = *plVar5;
    lStack_e0 = plVar2[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar5;
    local_f8 = (long *)*plVar2;
  }
  local_f0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    lVar1 = plVar2[3];
    local_78->_M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_98 = &local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,'\x03');
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2afa95);
  local_198 = &local_188;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_188 = *plVar5;
    lStack_180 = plVar2[3];
  }
  else {
    local_188 = *plVar5;
    local_198 = (long *)*plVar2;
  }
  local_190 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_198);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_108 = *plVar5;
    lStack_100 = plVar2[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *plVar5;
    local_118 = (long *)*plVar2;
  }
  local_110 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_178 = &local_168;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_168 = *plVar5;
    lStack_160 = plVar2[3];
  }
  else {
    local_168 = *plVar5;
    local_178 = (long *)*plVar2;
  }
  local_170 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_178,multifaq::dir::PATH_TO_DATA_abi_cxx11_);
  local_158 = &local_148;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_148 = *plVar5;
    lStack_140 = plVar2[3];
  }
  else {
    local_148 = *plVar5;
    local_158 = (long *)*plVar2;
  }
  local_150 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
  local_1b8 = &local_1a8;
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_1a8 = *puVar4;
    lStack_1a0 = plVar2[3];
  }
  else {
    local_1a8 = *puVar4;
    local_1b8 = (ulong *)*plVar2;
  }
  local_1b0 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,'\x03');
  uVar7 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar7 = local_1a8;
  }
  if (uVar7 < (ulong)(local_d0 + local_1b0)) {
    uVar7 = 0xf;
    if (local_d8 != &local_c8) {
      uVar7 = local_c8;
    }
    if ((ulong)(local_d0 + local_1b0) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_1b8);
      goto LAB_0022bfd7;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_d8);
LAB_0022bfd7:
  local_1d8 = &local_1c8;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1c8 = *plVar2;
    lStack_1c0 = puVar3[3];
  }
  else {
    local_1c8 = *plVar2;
    local_1d8 = (long *)*puVar3;
  }
  local_1d0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  local_138 = &local_128;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_128 = *plVar5;
    lStack_120 = plVar2[3];
  }
  else {
    local_128 = *plVar5;
    local_138 = (long *)*plVar2;
  }
  local_130 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_138,multifaq::dir::PATH_TO_DATA_abi_cxx11_);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_a8 = *plVar5;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar5;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_e8 = *plVar5;
    lStack_e0 = plVar2[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar5;
    local_f8 = (long *)*plVar2;
  }
  local_f0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genHeader()
{   
    std::string s = "DATAHANDLER";
    std::string header = "#ifndef INCLUDE_"+s+"_HPP_\n"+
        "#define INCLUDE_"+s+"_HPP_\n\n"+
        "#include <algorithm>\n"+
        "#include <chrono>\n"+
        "#include <cstring>\n"+
        "#include <fstream>\n"+
        "#include <iostream>\n" +
        "#include <thread>\n" +
        "#include <unordered_map>\n" +
        "#include <vector>\n\n";

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
   header += "#include <parallel/algorithm>\n";
#endif
    
   header += "using namespace std::chrono;\n\nnamespace lmfao\n{\n"+
        offset(1)+"//const std::string PATH_TO_DATA = \"/Users/Maximilian/Documents/"+
        "Oxford/LMFAO/"+PATH_TO_DATA+"\";\n"+
        offset(1)+"const std::string PATH_TO_DATA = \"../../"+PATH_TO_DATA+"\";\n\n";

   return header;
}